

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O0

Token __thiscall trieste::detail::find_token(detail *this,string_view str)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  iterator it;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
  *map;
  string_view str_local;
  
  str_local._M_len = str._M_len;
  map = (map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
         *)this;
  it._M_node = (_Base_ptr)token_map();
  local_30._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
       ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
               *)it._M_node,(key_type *)&map);
  local_38._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
       ::end(it._M_node);
  bVar1 = CLI::std::operator==(&local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Token::Token((Token *)&str_local._M_str,(TokenDef *)Invalid);
  }
  else {
    ppVar2 = CLI::std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>
             ::operator->(&local_30);
    str_local._M_str = (char *)(ppVar2->second).def;
  }
  return (Token)(TokenDef *)str_local._M_str;
}

Assistant:

inline Token find_token(std::string_view str)
    {
      auto& map = token_map();
      auto it = map.find(str);

      if (it != map.end())
        return it->second;

      return Invalid;
    }